

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noop.cc
# Opt level: O2

base_learner * noop_setup(options_i *options,vw *param_2)

{
  learner<char,_example> *plVar1;
  bool noop;
  allocator local_1e2;
  allocator local_1e1;
  string local_1e0 [32];
  string local_1c0;
  string local_1a0;
  option_group_definition new_options;
  undefined1 local_148 [112];
  bool local_d8;
  typed_option<bool> local_a8;
  
  noop = false;
  std::__cxx11::string::string((string *)&local_1a0,"Noop Learner",(allocator *)local_148);
  VW::config::option_group_definition::option_group_definition(&new_options,&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::string((string *)&local_1c0,"noop",&local_1e1);
  VW::config::typed_option<bool>::typed_option((typed_option<bool> *)local_148,&local_1c0,&noop);
  local_d8 = true;
  std::__cxx11::string::string(local_1e0,"do no learning",&local_1e2);
  std::__cxx11::string::_M_assign((string *)(local_148 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_a8,(typed_option<bool> *)local_148);
  VW::config::option_group_definition::add<bool>(&new_options,&local_a8);
  VW::config::typed_option<bool>::~typed_option(&local_a8);
  std::__cxx11::string::~string(local_1e0);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_148);
  std::__cxx11::string::~string((string *)&local_1c0);
  (**options->_vptr_options_i)(options,&new_options);
  if (noop == false) {
    plVar1 = (learner<char,_example> *)0x0;
  }
  else {
    plVar1 = LEARNER::init_learner<char,example,LEARNER::learner<char,char>>(learn,1);
  }
  VW::config::option_group_definition::~option_group_definition(&new_options);
  return (base_learner *)plVar1;
}

Assistant:

LEARNER::base_learner* noop_setup(options_i& options, vw&)
{
  bool noop = false;
  option_group_definition new_options("Noop Learner");
  new_options.add(make_option("noop", noop).keep().help("do no learning"));
  options.add_and_parse(new_options);

  if (!noop)
    return nullptr;

  return make_base(LEARNER::init_learner(learn, 1));
}